

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_ugm::llm_tokenizer_ugm
          (llm_tokenizer_ugm *this,llama_vocab *vocab,
          vector<char,_std::allocator<char>_> *precompiled_charsmap)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  uint *puVar5;
  runtime_error *this_00;
  _func_int **pp_Var6;
  token_data *ptVar7;
  float *pfVar8;
  vector<char,_std::allocator<char>_> *in_RDX;
  llm_tokenizer *in_RDI;
  int32_t in_stack_0000000c;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  naive_trie *in_stack_00000020;
  token_data *token_data;
  uint32_t id;
  uint32_t xcda_blob_size;
  size_t charsmap_offset;
  llm_tokenizer *in_stack_ffffffffffffff28;
  naive_trie *in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  uint local_40;
  allocator<char> local_19;
  vector<char,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  llm_tokenizer::llm_tokenizer(in_RDI);
  in_RDI->_vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_ugm_00644300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,
             (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  std::allocator<char>::~allocator(&local_19);
  in_RDI[5]._vptr_llm_tokenizer = (_func_int **)0x0;
  in_RDI[6]._vptr_llm_tokenizer = (_func_int **)0x0;
  in_RDI[7]._vptr_llm_tokenizer = (_func_int **)0x0;
  in_RDI[8]._vptr_llm_tokenizer = (_func_int **)0x0;
  naive_trie::naive_trie(in_stack_ffffffffffffff30);
  *(undefined4 *)&in_RDI[0x10]._vptr_llm_tokenizer = 0x7f7fffff;
  *(undefined4 *)((long)&in_RDI[0x10]._vptr_llm_tokenizer + 4) = 0xff7fffff;
  *(undefined4 *)&in_RDI[0x11]._vptr_llm_tokenizer = 0x41200000;
  naive_trie::naive_trie(in_stack_ffffffffffffff30);
  sVar4 = std::vector<char,_std::allocator<char>_>::size(local_18);
  if (sVar4 != 0) {
    puVar5 = (uint *)llama_vocab::std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_18,0);
    uVar1 = *puVar5;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(local_18);
    if (sVar4 <= (ulong)uVar1 + 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Index out of array bounds in precompiled charsmap!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pp_Var6 = (_func_int **)
              llama_vocab::std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_18,4);
    in_RDI[7]._vptr_llm_tokenizer = pp_Var6;
    in_RDI[8]._vptr_llm_tokenizer = (_func_int **)(ulong)(uVar1 >> 2);
    pp_Var6 = (_func_int **)
              llama_vocab::std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_18,(ulong)uVar1 + 4);
    in_RDI[5]._vptr_llm_tokenizer = pp_Var6;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(local_18);
    in_RDI[6]._vptr_llm_tokenizer = (_func_int **)(sVar4 - ((ulong)uVar1 + 4));
  }
  for (local_40 = 0; uVar3 = llama_vocab::n_tokens((llama_vocab *)0x55498e), local_40 < uVar3;
      local_40 = local_40 + 1) {
    ptVar7 = llama_vocab::get_token_data
                       ((llama_vocab *)in_stack_ffffffffffffff30,
                        (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    bVar2 = llama_vocab::is_normal
                      ((llama_vocab *)in_stack_ffffffffffffff30,
                       (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if (bVar2) {
      pfVar8 = llama_vocab::std::min<float>((float *)(in_RDI + 0x10),&ptVar7->score);
      *(float *)&in_RDI[0x10]._vptr_llm_tokenizer = *pfVar8;
      pfVar8 = std::max<float>((float *)((long)&in_RDI[0x10]._vptr_llm_tokenizer + 4),&ptVar7->score
                              );
      *(float *)((long)&in_RDI[0x10]._vptr_llm_tokenizer + 4) = *pfVar8;
    }
    bVar2 = llama_vocab::is_normal
                      ((llama_vocab *)in_stack_ffffffffffffff30,
                       (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if (((bVar2) ||
        (bVar2 = llama_vocab::is_user_defined
                           ((llama_vocab *)in_stack_ffffffffffffff30,
                            (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20)), bVar2)) ||
       (bVar2 = llama_vocab::is_unused
                          ((llama_vocab *)in_stack_ffffffffffffff30,
                           (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20)), bVar2)) {
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      naive_trie::insert(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c);
    }
    bVar2 = llama_vocab::is_user_defined
                      ((llama_vocab *)in_stack_ffffffffffffff30,
                       (llama_token)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if (bVar2) {
      in_stack_ffffffffffffff28 = in_RDI + 9;
      in_stack_ffffffffffffff30 = (naive_trie *)std::__cxx11::string::data();
      std::__cxx11::string::size();
      naive_trie::insert(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c);
    }
  }
  *(float *)((long)&in_RDI[0x11]._vptr_llm_tokenizer + 4) =
       *(float *)&in_RDI[0x10]._vptr_llm_tokenizer - *(float *)&in_RDI[0x11]._vptr_llm_tokenizer;
  return;
}

Assistant:

llm_tokenizer_ugm(const llama_vocab & vocab, const std::vector<char> & precompiled_charsmap) {
        if (precompiled_charsmap.size() > 0) {
            size_t charsmap_offset = 0;

            // First four bytes of precompiled_charsmap contains length of binary
            // blob containing XOR-compressed compact double array (XCDA) entries
            uint32_t xcda_blob_size = *(const uint32_t *) &precompiled_charsmap[0];
            charsmap_offset += sizeof(xcda_blob_size);
            if (xcda_blob_size + charsmap_offset >= precompiled_charsmap.size()) {
                throw std::runtime_error("Index out of array bounds in precompiled charsmap!");
            }

            // Next xcda_blob_size bytes contain entries of XOR-compressed compact
            // double array (XCDA). Each entry is bit-packed into a 32-bit integer.
            xcda_array = (const uint32_t *) &precompiled_charsmap[charsmap_offset];
            xcda_array_size = xcda_blob_size / sizeof(uint32_t);
            charsmap_offset += xcda_blob_size;

            // Remaining bytes of precompiled charsmap contain null-terminated
            // replacement strings for prefixes matched by the XCDA.
            prefix_replacements = &precompiled_charsmap[charsmap_offset];
            prefix_replacements_size = precompiled_charsmap.size() - charsmap_offset;
        }

        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & token_data = vocab.get_token_data(id);

            if (vocab.is_normal(id)) {
                min_score = std::min<float>(min_score, token_data.score);
                max_score = std::max<float>(max_score, token_data.score);
            }

            if (vocab.is_normal(id) ||
                vocab.is_user_defined(id) ||
                vocab.is_unused(id)) {
                token_matcher.insert(token_data.text.data(), token_data.text.size(), id);
            }

            if (vocab.is_user_defined(id)) {
                user_defined_token_matcher.insert(token_data.text.data(), token_data.text.size());
            }
        }

        unknown_token_score = min_score - unknown_token_score_penalty;
    }